

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void altersingle(nn_quant *nnq,int alpha,int i,int al,int b,int g,int r)

{
  int iVar1;
  int iVar2;
  
  iVar1 = nnq->network[i][0];
  iVar2 = nnq->network[i][1];
  nnq->network[i][0] = ((iVar1 - al) * alpha) / -0x400 + iVar1;
  nnq->network[i][1] = ((iVar2 - b) * alpha) / -0x400 + iVar2;
  iVar1 = nnq->network[i][2];
  nnq->network[i][2] = ((iVar1 - g) * alpha) / -0x400 + iVar1;
  iVar1 = nnq->network[i][3];
  nnq->network[i][3] = ((iVar1 - r) * alpha) / -0x400 + iVar1;
  return;
}

Assistant:

void altersingle(nnq, alpha,i,al,b,g,r)
nn_quant *nnq;
register int alpha,i,al,b,g,r;
{
	register int *n;

	n = nnq->network[i];	/* alter hit neuron */
	*n -= (alpha*(*n - al)) / initalpha;
	n++;
	*n -= (alpha*(*n - b)) / initalpha;
	n++;
	*n -= (alpha*(*n - g)) / initalpha;
	n++;
	*n -= (alpha*(*n - r)) / initalpha;
}